

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

namespace_t __thiscall cs::instance_type::import(instance_type *this,string *path,string *name)

{
  string *cxt;
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  compiler_type *this_00;
  element_type *peVar4;
  instance_type *this_01;
  pointer pbVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  size_t sVar8;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  fatal_error *this_02;
  runtime_error *prVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type sVar11;
  pointer __lhs;
  namespace_t nVar12;
  context_t rt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string package_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collection;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_2a8 [2];
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_288;
  string tmp;
  byte abStack_250 [488];
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [3];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  collection.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  collection.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  collection.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  pcVar2 = (name->_M_dataplus)._M_p;
  sVar3 = name->_M_string_length;
  for (sVar11 = 0; sVar3 != sVar11; sVar11 = sVar11 + 1) {
    if (pcVar2[sVar11] == ':') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&collection,&tmp);
      tmp._M_string_length = 0;
      *tmp._M_dataplus._M_p = '\0';
    }
    else {
      std::__cxx11::string::push_back((char)&tmp);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&collection,&tmp);
  std::__cxx11::string::~string((string *)&tmp);
  pbVar5 = collection.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cxt = path + 9;
  __lhs = collection.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (__lhs == pbVar5) {
      this_02 = (fatal_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&tmp,"No such file or directory.",(allocator *)&package_path);
      fatal_error::fatal_error(this_02,&tmp);
      __cxa_throw(this_02,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    std::operator+(&tmp,__lhs,'/');
    std::operator+(&package_path,&tmp,in_RCX);
    std::__cxx11::string::~string((string *)&tmp);
    sVar8 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
                        *)&((((element_type *)(cxt->_M_dataplus)._M_p)->compiler).
                            super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->modules,&package_path);
    if (sVar8 != 0) break;
    std::operator+(&local_308,&package_path,".csp");
    std::ifstream::ifstream(&tmp,(string *)&local_308,_S_in);
    bVar1 = abStack_250[*(long *)(tmp._M_dataplus._M_p + -0x18)];
    std::ifstream::~ifstream(&tmp);
    std::__cxx11::string::~string((string *)&local_308);
    if ((bVar1 & 5) == 0) {
      create_subcontext((cs *)&rt,(context_t *)cxt);
      this_00 = ((rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::operator+(&tmp,&package_path,".csp");
      std::operator+(&local_308,&package_path,".csym");
      compiler_type::import_csym(this_00,&tmp,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&tmp);
      peVar4 = ((rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_288,&rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
      _Var6._M_pi = local_288._M_refcount._M_pi;
      local_288._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48 = (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      a_Stack_40[0]._M_pi =
           (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_288._M_ptr;
      (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = _Var6._M_pi;
      local_288._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
      this_01 = ((rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::operator+(&tmp,&package_path,".csp");
      compile(this_01,&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      peVar4 = (((element_type *)(cxt->_M_dataplus)._M_p)->compiler).
               super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (local_2a8,(__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)cxt);
      _Var6._M_pi = local_2a8[0]._M_refcount._M_pi;
      local_2a8[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68 = (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      a_Stack_60[0]._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(peVar4->context).
                   super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi;
      (peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_2a8[0]._M_ptr;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(peVar4->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> + 8
      ))->_M_pi = _Var6._M_pi;
      local_2a8[0]._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8[0]._M_refcount);
      interpret(((rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (((rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          package_name)._M_string_length == 0) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&tmp,"Target file is not a package.",(allocator *)&local_308);
        runtime_error::runtime_error(prVar10,&tmp);
        __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      bVar7 = std::operator!=(&(rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->package_name,in_RCX);
      if (bVar7) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&tmp,"Package name is different from file name.",
                   (allocator *)&local_308);
        runtime_error::runtime_error(prVar10,&tmp);
        __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      domain_manager::get_namespace((domain_manager *)&tmp);
      std::make_shared<cs::name_space,cs::name_space&>((name_space *)this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmp._M_string_length);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
      ::
      emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                  *)&tmp,(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                          *)&((((element_type *)(cxt->_M_dataplus)._M_p)->compiler).
                              super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->modules,&package_path,(shared_ptr<cs::name_space> *)this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rt.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      goto LAB_00121fea;
    }
    std::operator+(&local_308,&package_path,".cse");
    std::ifstream::ifstream(&tmp,(string *)&local_308,_S_in);
    bVar1 = abStack_250[*(long *)(tmp._M_dataplus._M_p + -0x18)];
    std::ifstream::~ifstream(&tmp);
    std::__cxx11::string::~string((string *)&local_308);
    if ((bVar1 & 5) == 0) {
      std::operator+(&tmp,&package_path,".cse");
      std::make_shared<cs::extension,std::__cxx11::string>(&local_308);
      sVar3 = local_308._M_string_length;
      local_308._M_string_length = 0;
      (this->super_runtime_type).literals.
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = local_308._M_dataplus._M_p;
      (this->super_runtime_type).literals.
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .slots_ = (slot_type *)sVar3;
      local_308._M_dataplus._M_p = (ctrl_t *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_308._M_string_length);
      std::__cxx11::string::~string((string *)&tmp);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
      ::
      emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                  *)&tmp,(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                          *)&((((element_type *)(cxt->_M_dataplus)._M_p)->compiler).
                              super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->modules,&package_path,(shared_ptr<cs::name_space> *)this);
      goto LAB_00121fea;
    }
    std::__cxx11::string::~string((string *)&package_path);
    __lhs = __lhs + 1;
  }
  p_Var9 = &phmap::priv::
            raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
            ::
            operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
                      ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
                        *)&((((element_type *)(cxt->_M_dataplus)._M_p)->compiler).
                            super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->modules,&package_path)->
            super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var9);
LAB_00121fea:
  std::__cxx11::string::~string((string *)&package_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&collection);
  nVar12.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  nVar12.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (namespace_t)nVar12.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

namespace_t instance_type::import(const std::string &path, const std::string &name)
	{
		std::vector<std::string> collection;
		{
			std::string tmp;
			for (auto &ch: path) {
				if (ch == cs::path_delimiter) {
					collection.push_back(tmp);
					tmp.clear();
				}
				else
					tmp.push_back(ch);
			}
			collection.push_back(tmp);
		}
		for (auto &it: collection) {
			std::string package_path = it + path_separator + name;
			if (context->compiler->modules.count(package_path) > 0)
				return context->compiler->modules[package_path];
			if (std::ifstream(package_path + ".csp")) {
				context_t rt = create_subcontext(context);
				rt->compiler->import_csym(package_path + ".csp", package_path + ".csym");
				rt->compiler->swap_context(rt);
				try {
					rt->instance->compile(package_path + ".csp");
				}
				catch (...) {
					context->compiler->swap_context(context);
					throw;
				}
				context->compiler->swap_context(context);
				rt->instance->interpret();
				if (rt->package_name.empty())
					throw runtime_error("Target file is not a package.");
				if (rt->package_name != name)
					throw runtime_error("Package name is different from file name.");
				namespace_t module = std::make_shared<name_space>(*rt->instance->storage.get_namespace());
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
			else if (std::ifstream(package_path + ".cse")) {
				namespace_t module = std::make_shared<extension>(package_path + ".cse");
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
		}
		throw fatal_error("No such file or directory.");
	}